

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined1 local_100 [8];
  string exception;
  string local_80;
  string local_60;
  string local_40;
  allocator<char> local_19;
  
  if (argc < 3) {
    printf("Launch parameters: ./substrings [input_file] [output_file]");
  }
  else {
    SuffixTree::GeneralizedSuffixTree::GeneralizedSuffixTree((GeneralizedSuffixTree *)local_100);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,argv[1],&local_19);
    SuffixTree::GeneralizedSuffixTree::BuildSuffixTreeFromFile
              ((GeneralizedSuffixTree *)local_100,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,argv[2],&local_19);
    SuffixTree::GeneralizedSuffixTree::DumpCommonStringsToFile
              ((GeneralizedSuffixTree *)local_100,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"gtree.dot",&local_19);
    SuffixTree::GeneralizedSuffixTree::DumpSuffixTreeToDotFile
              ((GeneralizedSuffixTree *)local_100,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    SuffixTree::GeneralizedSuffixTree::~GeneralizedSuffixTree((GeneralizedSuffixTree *)local_100);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    if (argc < 3)
	{
		printf ("Launch parameters: ./substrings [input_file] [output_file]");
		return 0;
	}
	try
    {
        SuffixTree::GeneralizedSuffixTree suffix_tree;
        suffix_tree.BuildSuffixTreeFromFile (argv[1]);
        suffix_tree.DumpCommonStringsToFile (argv[2]);
#ifndef NDEBUG
        suffix_tree.DumpSuffixTreeToDotFile ("gtree.dot");
#endif
    }
    catch (std::exception exception)
    {
        printf ("%s\n", exception.what());
        exit (EXIT_FAILURE);
    }
    catch (std::string exception)
    {
        printf ("%s\n", exception.c_str());
        exit (EXIT_FAILURE);
    }
    return 0;
}